

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void mkdir_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (req == &mkdir_req) {
    if (mkdir_req.fs_type == UV_FS_MKDIR) {
      if (mkdir_req.result == 0) {
        mkdir_cb_count = mkdir_cb_count + 1;
        if (mkdir_req.path == (char *)0x0) {
          pcVar3 = "req->path";
          uVar2 = 0x208;
        }
        else {
          iVar1 = bcmp(mkdir_req.path,"test_dir",9);
          if (iVar1 == 0) {
            uv_fs_req_cleanup(&mkdir_req);
            return;
          }
          pcVar3 = "memcmp(req->path, \"test_dir\\0\", 9) == 0";
          uVar2 = 0x209;
        }
      }
      else {
        pcVar3 = "req->result == 0";
        uVar2 = 0x206;
      }
    }
    else {
      pcVar3 = "req->fs_type == UV_FS_MKDIR";
      uVar2 = 0x205;
    }
  }
  else {
    pcVar3 = "req == &mkdir_req";
    uVar2 = 0x204;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void mkdir_cb(uv_fs_t* req) {
  ASSERT(req == &mkdir_req);
  ASSERT(req->fs_type == UV_FS_MKDIR);
  ASSERT(req->result == 0);
  mkdir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
}